

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O3

UChar32 utf16BEIteratorPrevious(UCharIterator *iter)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = iter->index;
  uVar2 = 0xffffffff;
  if (iter->start < iVar1) {
    iter->index = iVar1 + -1;
    uVar2 = (uint)CONCAT11(*(undefined1 *)((long)iter->context + (long)iVar1 * 2 + -2),
                           *(undefined1 *)((long)iter->context + (long)(iVar1 * 2 + -2) + 1));
  }
  return uVar2;
}

Assistant:

static UChar32 U_CALLCONV
utf16BEIteratorPrevious(UCharIterator *iter) {
    int32_t index;

    if((index=iter->index)>iter->start) {
        iter->index=--index;
        return utf16BEIteratorGet(iter, index);
    } else {
        return U_SENTINEL;
    }
}